

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_st_xdr.c
# Opt level: O0

_Bool xdr_rpcbs_rmtcalllist(XDR *xdrs,rpcbs_rmtcalllist *objp)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t *puVar4;
  int32_t *buf;
  rpcbs_rmtcalllist *objp_local;
  XDR *xdrs_local;
  
  if (xdrs->x_op == XDR_ENCODE) {
    puVar4 = (uint32_t *)xdr_inline_encode(xdrs,0x18);
    if (puVar4 == (uint32_t *)0x0) {
      _Var1 = xdr_putuint32(xdrs,objp->prog);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR prog %u","xdr_rpcbs_rmtcalllist",0x59,(ulong)objp->prog);
        }
        return false;
      }
      _Var1 = xdr_putuint32(xdrs,objp->vers);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR vers %u","xdr_rpcbs_rmtcalllist",0x5f,(ulong)objp->vers);
        }
        return false;
      }
      _Var1 = xdr_putuint32(xdrs,objp->proc);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR proc %u","xdr_rpcbs_rmtcalllist",0x65,(ulong)objp->proc);
        }
        return false;
      }
      _Var1 = xdr_putint32(xdrs,objp->success);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR success %u","xdr_rpcbs_rmtcalllist",0x6b,
                     (ulong)(uint)objp->success);
        }
        return false;
      }
      _Var1 = xdr_putint32(xdrs,objp->failure);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR failure %u","xdr_rpcbs_rmtcalllist",0x71,
                     (ulong)(uint)objp->failure);
        }
        return false;
      }
      _Var1 = xdr_putint32(xdrs,objp->indirect);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR indirect %u","xdr_rpcbs_rmtcalllist",0x77,
                     (ulong)(uint)objp->indirect);
        }
        return false;
      }
    }
    else {
      uVar2 = htonl(objp->prog);
      *puVar4 = uVar2;
      uVar2 = htonl(objp->vers);
      puVar4[1] = uVar2;
      uVar2 = htonl(objp->proc);
      puVar4[2] = uVar2;
      uVar2 = htonl(objp->success);
      puVar4[3] = uVar2;
      uVar2 = htonl(objp->failure);
      puVar4[4] = uVar2;
      uVar2 = htonl(objp->indirect);
      puVar4[5] = uVar2;
    }
    _Var1 = xdr_string_encode(xdrs,&objp->netid,9000);
    if (_Var1) {
      uVar3 = xdr_pointer((XDR *)xdrs,(char **)&objp->next,0x28,xdr_rpcbs_rmtcalllist);
      if ((uVar3 & 1) == 0) {
        xdrs_local._7_1_ = false;
      }
      else {
        xdrs_local._7_1_ = true;
      }
    }
    else {
      xdrs_local._7_1_ = false;
    }
    return xdrs_local._7_1_;
  }
  if (xdrs->x_op == XDR_DECODE) {
    puVar4 = (uint32_t *)xdr_inline_decode(xdrs,0x18);
    if (puVar4 == (uint32_t *)0x0) {
      _Var1 = xdr_getuint32(xdrs,&objp->prog);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR prog","xdr_rpcbs_rmtcalllist",0x91);
        }
        return false;
      }
      _Var1 = xdr_getuint32(xdrs,&objp->vers);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR vers","xdr_rpcbs_rmtcalllist",0x96);
        }
        return false;
      }
      _Var1 = xdr_getuint32(xdrs,&objp->proc);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR proc","xdr_rpcbs_rmtcalllist",0x9b);
        }
        return false;
      }
      _Var1 = xdr_getint32(xdrs,&objp->success);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR success","xdr_rpcbs_rmtcalllist",0xa0);
        }
        return false;
      }
      _Var1 = xdr_getint32(xdrs,&objp->failure);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR failure","xdr_rpcbs_rmtcalllist",0xa5);
        }
        return false;
      }
      _Var1 = xdr_getint32(xdrs,&objp->indirect);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR indirect","xdr_rpcbs_rmtcalllist",0xaa);
        }
        return false;
      }
    }
    else {
      uVar2 = ntohl(*puVar4);
      objp->prog = uVar2;
      uVar2 = ntohl(puVar4[1]);
      objp->vers = uVar2;
      uVar2 = ntohl(puVar4[2]);
      objp->proc = uVar2;
      uVar2 = ntohl(puVar4[3]);
      objp->success = uVar2;
      uVar2 = ntohl(puVar4[4]);
      objp->failure = uVar2;
      uVar2 = ntohl(puVar4[5]);
      objp->indirect = uVar2;
    }
    _Var1 = xdr_string_decode(xdrs,&objp->netid,9000);
    if (!_Var1) {
      return false;
    }
    uVar3 = xdr_pointer((XDR *)xdrs,(char **)&objp->next,0x28,xdr_rpcbs_rmtcalllist);
    if ((uVar3 & 1) == 0) {
      return false;
    }
    return true;
  }
  _Var1 = xdr_u_int32_t(xdrs,&objp->prog);
  if (!_Var1) {
    return false;
  }
  _Var1 = xdr_u_int32_t(xdrs,&objp->vers);
  if (!_Var1) {
    return false;
  }
  _Var1 = xdr_u_int32_t(xdrs,&objp->proc);
  if (!_Var1) {
    return false;
  }
  uVar3 = xdr_int32_t((XDR *)xdrs,&objp->success);
  if ((uVar3 & 1) == 0) {
    return false;
  }
  uVar3 = xdr_int32_t((XDR *)xdrs,&objp->failure);
  if ((uVar3 & 1) == 0) {
    return false;
  }
  uVar3 = xdr_int32_t((XDR *)xdrs,&objp->indirect);
  if ((uVar3 & 1) == 0) {
    return false;
  }
  uVar3 = xdr_string((XDR *)xdrs,&objp->netid,9000);
  if ((uVar3 & 1) == 0) {
    return false;
  }
  uVar3 = xdr_pointer((XDR *)xdrs,(char **)&objp->next,0x28,xdr_rpcbs_rmtcalllist);
  if ((uVar3 & 1) == 0) {
    return false;
  }
  return true;
}

Assistant:

bool
xdr_rpcbs_rmtcalllist(XDR *xdrs, rpcbs_rmtcalllist *objp)
{
	int32_t *buf;

	if (xdrs->x_op == XDR_ENCODE) {
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			IXDR_PUT_U_INT32(buf, objp->prog);
			IXDR_PUT_U_INT32(buf, objp->vers);
			IXDR_PUT_U_INT32(buf, objp->proc);
			IXDR_PUT_INT32(buf, objp->success);
			IXDR_PUT_INT32(buf, objp->failure);
			IXDR_PUT_INT32(buf, objp->indirect);
		} else if (!XDR_PUTUINT32(xdrs, objp->prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog %u",
				__func__, __LINE__,
				objp->prog);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers %u",
				__func__, __LINE__,
				objp->vers);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc %u",
				__func__, __LINE__,
				objp->proc);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->success)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success %u",
				__func__, __LINE__,
				objp->success);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->failure)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure %u",
				__func__, __LINE__,
				objp->failure);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->indirect)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect %u",
				__func__, __LINE__,
				objp->indirect);
			return (false);
		}
		if (!xdr_string_encode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (xdrs->x_op == XDR_DECODE) {
		buf = xdr_inline_decode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			objp->prog = (rpcprog_t) IXDR_GET_U_INT32(buf);
			objp->vers = (rpcvers_t) IXDR_GET_U_INT32(buf);
			objp->proc = (rpcproc_t) IXDR_GET_U_INT32(buf);
			objp->success = (int)IXDR_GET_INT32(buf);
			objp->failure = (int)IXDR_GET_INT32(buf);
			objp->indirect = (int)IXDR_GET_INT32(buf);
		} else if (!XDR_GETUINT32(xdrs, &(objp->prog))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->vers))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->proc))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->success))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->failure))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->indirect))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_string_decode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (!xdr_u_int32_t(xdrs, &objp->prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->vers))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->proc))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->success))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->failure))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->indirect))
		return (false);
	if (!xdr_string(xdrs, &objp->netid, RPC_MAXDATASIZE))
		return (false);
	if (!xdr_pointer(xdrs, (void **)&objp->next,
			 sizeof(rpcbs_rmtcalllist),
			 (xdrproc_t) xdr_rpcbs_rmtcalllist))
		return (false);

	return (true);
}